

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall
dxil_spv::Converter::Impl::emit_execution_modes_node_output(Impl *this,MDNode *output)

{
  uint32_t uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Builder *pBVar6;
  size_type sVar7;
  MDOperand *md;
  char *string;
  ulong uVar8;
  bool local_79;
  undefined1 local_60 [8];
  String name;
  MDNode *output_node;
  uint local_30;
  NodeMetadataTag tag;
  uint32_t i;
  uint32_t num_ops;
  uint32_t uStack_20;
  bool is_rw_sharing;
  NodeOutputMeta output_meta;
  MDNode *output_local;
  Impl *this_local;
  
  output_meta._4_8_ = output;
  memset(&num_ops,0,0xc);
  uStack_20 = node_parse_payload_stride((MDNode *)output_meta._4_8_,(bool *)((long)&i + 3));
  pBVar6 = builder(this);
  num_ops = spv::Builder::makeUintConstant(pBVar6,0,true);
  pBVar6 = builder(this);
  uVar1 = num_ops;
  sVar7 = std::
          vector<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
          ::size(&this->node_outputs);
  uVar3 = (int)sVar7 + 100;
  uVar8 = (ulong)uVar3;
  spv::Builder::addDecoration(pBVar6,uVar1,DecorationSpecId,uVar3);
  uVar3 = LLVMBC::MDNode::getNumOperands((MDNode *)output_meta._4_8_);
  for (local_30 = 0; local_30 < uVar3; local_30 = local_30 + 2) {
    uVar4 = get_constant_metadata<unsigned_int>((MDNode *)output_meta._4_8_,local_30);
    if (uVar4 == 0) {
      md = LLVMBC::MDNode::getOperand((MDNode *)output_meta._4_8_,local_30 + 1);
      name.field_2._8_8_ = LLVMBC::cast<LLVMBC::MDNode>(md);
      get_string_metadata_abi_cxx11_
                ((String *)local_60,(dxil_spv *)name.field_2._8_8_,(MDNode *)0x0,(uint)uVar8);
      pBVar6 = builder(this);
      uVar1 = num_ops;
      string = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)local_60);
      spv::Builder::addName(pBVar6,uVar1,string);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                               *)local_60,&(this->node_input).node_id);
      uVar8 = CONCAT71((int7)(uVar8 >> 8),bVar2);
      local_79 = false;
      if (bVar2) {
        uVar4 = (this->node_input).node_array_index;
        uVar5 = get_constant_metadata<unsigned_int>((MDNode *)name.field_2._8_8_,1);
        uVar8 = (ulong)uVar5;
        local_79 = uVar4 == uVar5;
      }
      output_meta.spec_constant_node_index._0_1_ = local_79;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)local_60);
    }
  }
  std::
  vector<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
  ::push_back(&this->node_outputs,(value_type *)&num_ops);
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_node_output(llvm::MDNode *output)
{
	NodeOutputMeta output_meta = {};

	bool is_rw_sharing;
	output_meta.payload_stride = node_parse_payload_stride(output, is_rw_sharing);
	output_meta.spec_constant_node_index = builder().makeUintConstant(0, true);
	builder().addDecoration(output_meta.spec_constant_node_index, spv::DecorationSpecId,
	                        int(NodeSpecIdOutputBase + node_outputs.size()));

	uint32_t num_ops = output->getNumOperands();
	for (uint32_t i = 0; i < num_ops; i += 2)
	{
		auto tag = DXIL::NodeMetadataTag(get_constant_metadata(output, i));
		if (tag == DXIL::NodeMetadataTag::NodeOutputID)
		{
			auto *output_node = llvm::cast<llvm::MDNode>(output->getOperand(i + 1));
			String name = get_string_metadata(output_node, 0);
			builder().addName(output_meta.spec_constant_node_index, name.c_str());

			// FIXME: This is probably not accurate for arrayed nodes.
			// Can recursive nodes be arrayed? Seems very spicy ...
			output_meta.is_recursive =
				name == node_input.node_id &&
				node_input.node_array_index == get_constant_metadata(output_node, 1);
		}
	}

	node_outputs.push_back(output_meta);
	return true;
}